

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandReadInit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  FILE *__stream;
  char *pcStack_48;
  int c;
  char *pFileName;
  Abc_Ntk_t *pNtk;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && ((argc == globalUtilOptind || (argc == globalUtilOptind + 1)))) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      fprintf(__stream,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      if (argc == globalUtilOptind + 1) {
        pcStack_48 = argv[globalUtilOptind];
      }
      else {
        if (pAVar2->pSpec == (char *)0x0) {
          printf("File name should be given on the command line.\n");
          return 1;
        }
        pcStack_48 = Extra_FileNameGenericAppend(pAVar2->pSpec,".init");
      }
      pAVar2 = Abc_NtkDup(pAVar2);
      Io_ReadBenchInit(pAVar2,pcStack_48);
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      Abc_FrameClearVerifStatus(pAbc);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: read_init [-h] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         reads initial state of the network in BENCH format\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : prints the command summary\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of a file to read\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandReadInit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind && argc != globalUtilOptind + 1 )
        goto usage;

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }
    // get the input file name
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( pNtk->pSpec )
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".init" );
    else
    {
        printf( "File name should be given on the command line.\n" );
        return 1;
    }

    // read the file using the corresponding file reader
    pNtk = Abc_NtkDup( pNtk );
    Io_ReadBenchInit( pNtk, pFileName );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_init [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         reads initial state of the network in BENCH format\n" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}